

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.h
# Opt level: O1

Status * __thiscall draco::PointCloudEncoder::EncodeGeometryData(PointCloudEncoder *this)

{
  Status *in_RDI;
  
  in_RDI->code_ = OK;
  (in_RDI->error_msg_)._M_dataplus._M_p = (pointer)&(in_RDI->error_msg_).field_2;
  (in_RDI->error_msg_)._M_string_length = 0;
  (in_RDI->error_msg_).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

virtual Status EncodeGeometryData() { return OkStatus(); }